

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall
BackwardPass::CaptureByteCodeUpwardExposed
          (BackwardPass *this,BasicBlock *block,Func *func,OpCode opcode,uint32 offset)

{
  code *pcVar1;
  OpCode OVar2;
  bool bVar3;
  RegSlot RVar4;
  undefined4 *puVar5;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  JITTimeFunctionBody *pJVar6;
  ByteCodeRegisterUses *this_01;
  char *this_02;
  undefined1 local_48 [8];
  InstrByteCodeRegisterUses instrUses;
  uint32 offset_local;
  
  this_02 = (char *)this;
  instrUses.bv._4_4_ = offset;
  bVar3 = DoCaptureByteCodeUpwardExposedUsed(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    this_02 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
    ;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x22f3,"(this->DoCaptureByteCodeUpwardExposedUsed())",
                       "this->DoCaptureByteCodeUpwardExposedUsed()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  this_00 = GetByteCodeRegisterUpwardExposed
                      ((BackwardPass *)this_02,block,func,this->globOpt->alloc);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            (this_00,block->excludeByteCodeUpwardExposedTracking);
  pJVar6 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
  RVar4 = JITTimeFunctionBody::GetEnvReg(pJVar6);
  if (RVar4 != 0xffffffff) {
    pJVar6 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
    RVar4 = JITTimeFunctionBody::GetEnvReg(pJVar6);
    BVSparse<Memory::JitArenaAllocator>::Clear(this_00,RVar4);
  }
  this_01 = func->byteCodeRegisterUses;
  if (this_01 == (ByteCodeRegisterUses *)0x0) {
    this_01 = (ByteCodeRegisterUses *)
              new<Memory::JitArenaAllocator>(0x38,this->globOpt->alloc,0x3eba5c);
    JsUtil::
    BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_01,this->globOpt->alloc,0);
    func->byteCodeRegisterUses = this_01;
  }
  bVar3 = JsUtil::
          BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValueAndRemove
                    (this_01,(uint *)((long)&instrUses.bv + 4),(InstrByteCodeRegisterUses *)local_48
                    );
  OVar2 = opcode;
  if (bVar3) {
    if (local_48._0_2_ == Leave) {
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (this->globOpt->alloc,this_00);
      OVar2 = local_48._0_2_;
      this_00 = (BVSparse<Memory::JitArenaAllocator> *)instrUses._0_8_;
    }
    else {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this_00,(BVSparse<Memory::JitArenaAllocator> *)instrUses._0_8_);
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (this->globOpt->alloc,(BVSparse<Memory::JitArenaAllocator> *)instrUses._0_8_);
      OVar2 = opcode;
    }
  }
  instrUses._0_8_ = this_00;
  local_48._0_2_ = OVar2;
  JsUtil::
  BaseDictionary<unsigned_int,Func::InstrByteCodeRegisterUses,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<unsigned_int,Func::InstrByteCodeRegisterUses,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<unsigned_int,Func::InstrByteCodeRegisterUses,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)func->byteCodeRegisterUses,(uint *)((long)&instrUses.bv + 4),
             (InstrByteCodeRegisterUses *)local_48);
  return;
}

Assistant:

void
BackwardPass::CaptureByteCodeUpwardExposed(BasicBlock* block, Func* func, Js::OpCode opcode, uint32 offset)
{
    Assert(this->DoCaptureByteCodeUpwardExposedUsed());
    // Keep track of all the bytecode upward exposed after Backward's pass
    BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = GetByteCodeRegisterUpwardExposed(block, func, this->globOpt->alloc);
    byteCodeUpwardExposedUsed->Minus(block->excludeByteCodeUpwardExposedTracking);
    if (func->GetJITFunctionBody()->GetEnvReg() != Js::Constants::NoByteCodeOffset)
    {
        // No need to restore the environment so don't track it
        byteCodeUpwardExposedUsed->Clear(func->GetJITFunctionBody()->GetEnvReg());
    }
    if (!func->byteCodeRegisterUses)
    {
        func->byteCodeRegisterUses = JitAnew(this->globOpt->alloc, Func::ByteCodeRegisterUses, this->globOpt->alloc);
    }

    Func::InstrByteCodeRegisterUses instrUses;
    if (func->byteCodeRegisterUses->TryGetValueAndRemove(offset, &instrUses))
    {
        if (instrUses.capturingOpCode == Js::OpCode::Leave)
        {
            // Do not overwrite in the case of Leave
            JitAdelete(this->globOpt->alloc, byteCodeUpwardExposedUsed);
            func->byteCodeRegisterUses->Add(offset, instrUses);
            return;
        }
        byteCodeUpwardExposedUsed->Or(instrUses.bv);
        JitAdelete(this->globOpt->alloc, instrUses.bv);
    }

    instrUses.capturingOpCode = opcode;
    instrUses.bv = byteCodeUpwardExposedUsed;
    func->byteCodeRegisterUses->Add(offset, instrUses);
}